

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::TaggerImpl::initRequestType(TaggerImpl *this)

{
  Lattice *pLVar1;
  
  pLVar1 = mutable_lattice(this);
  (*pLVar1->_vptr_Lattice[0x13])(pLVar1,(ulong)(uint)this->request_type_);
  pLVar1 = mutable_lattice(this);
  (*pLVar1->_vptr_Lattice[0xe])((float)this->theta_,pLVar1);
  return;
}

Assistant:

void initRequestType() {
    mutable_lattice()->set_request_type(request_type_);
    mutable_lattice()->set_theta(theta_);
  }